

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

string * anon_unknown.dwarf_4856e::get_word(string *__return_storage_ptr__,string *str_to_parse)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  string *extraout_RAX;
  string *psVar4;
  ulong uVar5;
  string *local_48 [2];
  _Alloc_hider local_38;
  
  uVar1 = str_to_parse->_M_string_length;
  if (uVar1 == 0) {
    uVar5 = 0;
LAB_0010d83b:
    if (uVar5 < uVar1) {
      pcVar2 = (str_to_parse->_M_dataplus)._M_p;
      do {
        iVar3 = isspace((int)pcVar2[uVar5]);
        if (iVar3 != 0) break;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
  }
  else {
    pcVar2 = (str_to_parse->_M_dataplus)._M_p;
    uVar5 = 0;
    do {
      iVar3 = isspace((int)pcVar2[uVar5]);
      if (iVar3 == 0) goto LAB_0010d83b;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str_to_parse);
  std::__cxx11::string::substr((ulong)local_48,(ulong)str_to_parse);
  std::__cxx11::string::operator=((string *)str_to_parse,(string *)local_48);
  psVar4 = (string *)&local_38;
  if (local_48[0] != psVar4) {
    operator_delete(local_48[0],(ulong)(local_38._M_p + 1));
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

std::string get_word(std::string& str_to_parse) {
    size_t i = 0;
    for (; i < str_to_parse.size(); ++i) if (!std::isspace(str_to_parse[i])) break;
    for (; i < str_to_parse.size(); ++i) if (std::isspace(str_to_parse[i])) break;
    std::string word = str_to_parse.substr(0, i);
    str_to_parse = str_to_parse.substr(i);
    return word;
}